

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall
CFFFileInput::CalculateDependenciesForCharIndex
          (CFFFileInput *this,unsigned_short inFontIndex,unsigned_short inCharStringIndex,
          CharString2Dependencies *ioDependenciesInfo)

{
  EStatusCode EVar1;
  EStatusCode EVar2;
  CharString *inCharStringToIntepret;
  Trace *this_00;
  CharStringType2Interpreter interpreter;
  CharStringType2Interpreter CStack_78;
  
  CharStringType2Interpreter::CharStringType2Interpreter(&CStack_78);
  EVar1 = PrepareForGlyphIntepretation(this,inFontIndex,inCharStringIndex);
  EVar2 = eFailure;
  if (EVar1 != eFailure) {
    this->mCurrentDependencies = ioDependenciesInfo;
    inCharStringToIntepret = GetGlyphCharString(this,inFontIndex,inCharStringIndex);
    if (inCharStringToIntepret == (CharString *)0x0) {
      this_00 = Trace::DefaultTrace();
      Trace::TraceToLog(this_00,"GetGlyphCharString cannot find char string");
    }
    else {
      EVar2 = CharStringType2Interpreter::Intepret
                        (&CStack_78,inCharStringToIntepret,(IType2InterpreterImplementation *)this);
    }
  }
  CharStringType2Interpreter::~CharStringType2Interpreter(&CStack_78);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::CalculateDependenciesForCharIndex(unsigned short inFontIndex,
															unsigned short inCharStringIndex,
															CharString2Dependencies& ioDependenciesInfo)
{
	CharStringType2Interpreter interpreter;

	EStatusCode status = PrepareForGlyphIntepretation(inFontIndex,inCharStringIndex);
	if(status != PDFHummus::eFailure)
	{
		mCurrentDependencies = &ioDependenciesInfo;
		CharString* charString = GetGlyphCharString(inFontIndex,inCharStringIndex);
        if(!charString)
        {
            TRACE_LOG("GetGlyphCharString cannot find char string");
            return PDFHummus::eFailure;
        }
		return interpreter.Intepret(*charString, this);
	}
	else
		return status;
}